

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O3

void __thiscall
QGraphicsProxyWidget::resizeEvent(QGraphicsProxyWidget *this,QGraphicsSceneResizeEvent *event)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  QWidget *this_00;
  long in_FS_OFFSET;
  double dVar4;
  QSizeF QVar5;
  QSize local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 0x18);
  lVar2 = *(long *)(lVar1 + 0x208);
  if ((((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) &&
      (*(QWidget **)(lVar1 + 0x210) != (QWidget *)0x0)) && ((*(ushort *)(lVar1 + 0x244) & 0xc) != 8)
     ) {
    this_00 = *(QWidget **)(lVar1 + 0x210);
    if (*(int *)(lVar2 + 4) == 0) {
      this_00 = (QWidget *)0x0;
    }
    QVar5 = QGraphicsSceneResizeEvent::newSize(event);
    dVar4 = (double)((ulong)QVar5.wd & 0x8000000000000000 | 0x3fe0000000000000) + QVar5.wd;
    bVar3 = 2147483647.0 < dVar4;
    if (dVar4 <= -2147483648.0) {
      dVar4 = -2147483648.0;
    }
    local_28.wd.m_i =
         (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar4);
    dVar4 = (double)((ulong)QVar5.ht & 0x8000000000000000 | 0x3fe0000000000000) + QVar5.ht;
    bVar3 = 2147483647.0 < dVar4;
    if (dVar4 <= -2147483648.0) {
      dVar4 = -2147483648.0;
    }
    local_28.ht.m_i =
         (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar4);
    QWidget::resize(this_00,&local_28);
  }
  QGraphicsWidget::resizeEvent((QGraphicsWidget *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidget::resizeEvent(QGraphicsSceneResizeEvent *event)
{
    Q_D(QGraphicsProxyWidget);
    if (d->widget) {
        if (d->sizeChangeMode != QGraphicsProxyWidgetPrivate::WidgetToProxyMode)
            d->widget->resize(event->newSize().toSize());
    }
    QGraphicsWidget::resizeEvent(event);
}